

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O1

void ocmesh::details::skipcomments(istream *stream)

{
  char cVar1;
  int iVar2;
  
  while (iVar2 = std::istream::peek(), iVar2 == 0x23) {
    while (cVar1 = std::istream::peek(), cVar1 != '\n') {
      std::istream::get();
    }
    while( true ) {
      iVar2 = std::istream::peek();
      iVar2 = isspace(iVar2);
      if (iVar2 == 0) break;
      std::istream::get();
    }
  }
  return;
}

Assistant:

void skipcomments(std::istream &stream) {
        while(stream.peek() == '#') {
            skipwhile(stream, [](char c) { return c != '\n'; });
            skipwhile(stream, isspace);
        }
    }